

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Prog * re2::Compiler::CompileSet(Options *options,Anchor anchor,Regexp *re)

{
  ParseFlags flags;
  Frag b;
  Frag a;
  Prog *this;
  bool failed;
  StringPiece sp;
  Compiler c;
  
  Compiler(&c);
  flags = RE2::Options::ParseFlags(options);
  Setup(&c,flags,options->max_mem_,anchor);
  b = Regexp::Walker<re2::Frag>::WalkExponential
                (&c.super_Walker<re2::Frag>,re,(Frag)0x0,c.max_inst_ * 2);
  Regexp::Decref(re);
  if (c.failed_ == false) {
    if (anchor == UNANCHORED) {
      a = DotStar(&c);
      b = Cat(&c,a,b);
    }
    (c.prog_)->start_ = b.begin;
    (c.prog_)->start_unanchored_ = b.begin;
    (c.prog_)->anchor_start_ = true;
    (c.prog_)->anchor_end_ = true;
    this = Finish(&c);
    if (this != (Prog *)0x0) {
      sp.ptr_ = "hello, world";
      sp.length_ = 0xc;
      Prog::SearchDFA(this,&sp,&sp,kAnchored,kManyMatch,(StringPiece *)0x0,&failed,
                      (vector<int,_std::allocator<int>_> *)0x0);
      if (failed != true) goto LAB_0011dcaf;
      Prog::~Prog(this);
      operator_delete(this);
    }
  }
  this = (Prog *)0x0;
LAB_0011dcaf:
  ~Compiler(&c);
  return this;
}

Assistant:

Prog* Compiler::CompileSet(const RE2::Options& options, RE2::Anchor anchor,
                           Regexp* re) {
  Compiler c;

  Regexp::ParseFlags pf = static_cast<Regexp::ParseFlags>(options.ParseFlags());
  c.Setup(pf, options.max_mem(), anchor);

  // Compile alternation of fragments.
  Frag all = c.WalkExponential(re, Frag(), 2*c.max_inst_);
  re->Decref();
  if (c.failed_)
    return NULL;

  if (anchor == RE2::UNANCHORED) {
    // The trailing .* was added while handling kRegexpHaveMatch.
    // We just have to add the leading one.
    all = c.Cat(c.DotStar(), all);
  }

  c.prog_->set_start(all.begin);
  c.prog_->set_start_unanchored(all.begin);
  c.prog_->set_anchor_start(true);
  c.prog_->set_anchor_end(true);

  Prog* prog = c.Finish();
  if (prog == NULL)
    return NULL;

  // Make sure DFA has enough memory to operate,
  // since we're not going to fall back to the NFA.
  bool failed;
  StringPiece sp = "hello, world";
  prog->SearchDFA(sp, sp, Prog::kAnchored, Prog::kManyMatch,
                  NULL, &failed, NULL);
  if (failed) {
    delete prog;
    return NULL;
  }

  return prog;
}